

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::Builder(Builder *this,uint spvVersion,uint magicNumber,SpvBuildLogger *buildLogger)

{
  _Rb_tree_header *p_Var1;
  CoherentFlags *pCVar2;
  
  this->_vptr_Builder = (_func_int **)&PTR__Builder_0089f078;
  (this->debugTypeLocs)._M_h._M_buckets = &(this->debugTypeLocs)._M_h._M_single_bucket;
  (this->debugTypeLocs)._M_h._M_bucket_count = 1;
  (this->debugTypeLocs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->debugTypeLocs)._M_h._M_element_count = 0;
  (this->debugTypeLocs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->debugTypeLocs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->debugTypeLocs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->spvVersion = spvVersion;
  this->sourceLang = SourceLanguageUnknown;
  this->sourceVersion = 0;
  this->nonSemanticShaderCompilationUnitId = 0;
  this->nonSemanticShaderDebugInfo = 0;
  this->debugInfoNone = 0;
  this->debugExpression = 0;
  (this->sourceText)._M_dataplus._M_p = (pointer)&(this->sourceText).field_2;
  (this->sourceText)._M_string_length = 0;
  (this->sourceText).field_2._M_local_buf[0] = '\0';
  this->currentLine = 0;
  this->currentFileId = 0;
  this->mainFileId = 0;
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&this->currentDebugScopeId);
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  this->trackDebugInfo = false;
  this->emitSpirvDebugInfo = false;
  this->emitNonSemanticShaderDebugInfo = false;
  this->restoreNonSemanticShaderDebugInfo = false;
  this->emitNonSemanticShaderDebugSource = false;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sourceExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->moduleProcesses).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->moduleProcesses).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->moduleProcesses).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->moduleProcesses).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->memoryModel = GLSL450;
  p_Var1 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
  (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->builderNumber = magicNumber;
  (this->module)._vptr_Module = (_func_int **)&PTR__Module_0089f098;
  this->entryPointFunction = (Function *)0x0;
  this->generatingOpCodeForSpecConst = false;
  this->useReplicatedComposites = false;
  (this->accessChain).indexChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->accessChain).indexChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accessChain).indexChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&this->buildPoint + 4) = 0;
  (this->module).idToInstruction.
  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->module).idToInstruction.
  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->module).functions.super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->module).idToInstruction.
  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->module).functions.super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->module).functions.super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar2 = &(this->accessChain).coherentFlags;
  *(ushort *)pCVar2 = *(ushort *)pCVar2 & 0xf800;
  (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->decorations)._M_t._M_impl.super__Rb_tree_header;
  (this->strings).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->strings).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->strings).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->imports).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->imports).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->imports).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entryPoints).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entryPoints).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entryPoints).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->executionModes).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->executionModes).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->executionModes).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->names).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->functions).
  super__Vector_base<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_std::allocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functions).
  super__Vector_base<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_std::allocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->externals).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->functions).
  super__Vector_base<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_std::allocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->externals).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->externals).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constantsTypesGlobals).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constantsTypesGlobals).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->constantsTypesGlobals).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->groupedConstants)._M_h._M_buckets = &(this->groupedConstants)._M_h._M_single_bucket;
  (this->groupedConstants)._M_h._M_bucket_count = 1;
  (this->groupedConstants)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->groupedConstants)._M_h._M_element_count = 0;
  (this->groupedConstants)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->groupedConstants)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->groupedConstants)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->groupedStructConstants)._M_h._M_buckets =
       &(this->groupedStructConstants)._M_h._M_single_bucket;
  (this->groupedStructConstants)._M_h._M_bucket_count = 1;
  (this->groupedStructConstants)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->groupedStructConstants)._M_h._M_element_count = 0;
  (this->groupedStructConstants)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->groupedStructConstants)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->groupedStructConstants)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->groupedTypes)._M_h._M_buckets = &(this->groupedTypes)._M_h._M_single_bucket;
  (this->groupedTypes)._M_h._M_bucket_count = 1;
  (this->groupedTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->groupedTypes)._M_h._M_element_count = 0;
  (this->groupedTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->groupedTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->groupedTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->groupedDebugTypes)._M_h._M_buckets = &(this->groupedDebugTypes)._M_h._M_single_bucket;
  (this->groupedDebugTypes)._M_h._M_bucket_count = 1;
  (this->groupedDebugTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->groupedDebugTypes)._M_h._M_element_count = 0;
  (this->groupedDebugTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nullConstants).super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nullConstants).super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->groupedDebugTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->groupedDebugTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nullConstants).super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<spv::Block*,std::deque<spv::Block*,std::allocator<spv::Block*>>>::
  stack<std::deque<spv::Block*,std::allocator<spv::Block*>>,void>(&this->switchMerges);
  std::
  stack<spv::Builder::LoopBlocks,std::deque<spv::Builder::LoopBlocks,std::allocator<spv::Builder::LoopBlocks>>>
  ::stack<std::deque<spv::Builder::LoopBlocks,std::allocator<spv::Builder::LoopBlocks>>,void>
            (&this->loops);
  (this->stringIds)._M_h._M_buckets = &(this->stringIds)._M_h._M_single_bucket;
  (this->stringIds)._M_h._M_bucket_count = 1;
  (this->stringIds)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stringIds)._M_h._M_element_count = 0;
  (this->stringIds)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stringIds)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stringIds)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->includeFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->includeFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->debugId)._M_t._M_impl.super__Rb_tree_header;
  (this->debugId)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->debugId)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->debugId)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->debugId)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->debugId)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->debugSourceId)._M_h._M_buckets = &(this->debugSourceId)._M_h._M_single_bucket;
  (this->debugSourceId)._M_h._M_bucket_count = 1;
  (this->debugSourceId)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->debugSourceId)._M_h._M_element_count = 0;
  (this->debugSourceId)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->debugSourceId)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->debugSourceId)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->logger = buildLogger;
  clearAccessChain(this);
  return;
}

Assistant:

Builder::Builder(unsigned int spvVersion, unsigned int magicNumber, SpvBuildLogger* buildLogger) :
    spvVersion(spvVersion),
    sourceLang(SourceLanguageUnknown),
    sourceVersion(0),
    addressModel(AddressingModelLogical),
    memoryModel(MemoryModelGLSL450),
    builderNumber(magicNumber),
    buildPoint(nullptr),
    uniqueId(0),
    entryPointFunction(nullptr),
    generatingOpCodeForSpecConst(false),
    logger(buildLogger)
{
    clearAccessChain();
}